

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

Txid * __thiscall
cfd::core::AbstractTransaction::GetTxid(Txid *__return_storage_ptr__,AbstractTransaction *this)

{
  undefined1 local_30 [8];
  ByteData256 bytedata;
  AbstractTransaction *this_local;
  
  bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  GetHash((ByteData256 *)local_30,this);
  Txid::Txid(__return_storage_ptr__,(ByteData256 *)local_30);
  ByteData256::~ByteData256((ByteData256 *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Txid AbstractTransaction::GetTxid() const {
  ByteData256 bytedata = GetHash();
  return Txid(bytedata);
}